

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O1

void __thiscall
duckdb::ArrayColumnData::InitializeAppend(ArrayColumnData *this,ColumnAppendState *state)

{
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> uVar1;
  pointer pCVar2;
  ColumnAppendState child_append;
  ColumnAppendState validity_append;
  ColumnAppendState local_70;
  ColumnAppendState local_40;
  
  local_40.child_appends.
  super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
  super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.lock.
  super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
        )0x0;
  local_40.child_appends.
  super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
  super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.child_appends.
  super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
  super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40.append_state.
  super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
  .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
        )(__uniq_ptr_data<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>,_true,_true>
          )0x0;
  ColumnData::InitializeAppend(&(this->validity).super_ColumnData,&local_40);
  ::std::vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>::
  emplace_back<duckdb::ColumnAppendState>
            (&(state->child_appends).
              super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>,
             &local_40);
  local_70.child_appends.
  super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
  super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.lock.
  super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
        )0x0;
  local_70.child_appends.
  super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
  super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.child_appends.
  super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
  super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.append_state.
  super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
  .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
        )(__uniq_ptr_data<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>,_true,_true>
          )0x0;
  pCVar2 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  (*pCVar2->_vptr_ColumnData[0x11])(pCVar2,&local_70);
  ::std::vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>::
  emplace_back<duckdb::ColumnAppendState>
            (&(state->child_appends).
              super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>,
             &local_70);
  if (local_70.append_state.
      super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
      .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_70.append_state.
                          super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
                          .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>.
                          _M_head_impl + 8))();
  }
  uVar1.super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       local_70.lock;
  local_70.append_state.
  super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
  .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
        )(__uniq_ptr_data<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>,_true,_true>
          )0x0;
  if (local_70.lock.
      super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
      super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
      .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
       )0x0) {
    StorageLockKey::~StorageLockKey
              ((StorageLockKey *)
               local_70.lock.
               super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
               .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl);
    operator_delete((void *)uVar1.
                            super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
                            .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl);
  }
  local_70.lock.
  super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
        )0x0;
  ::std::vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>::~vector
            (&local_70.child_appends.
              super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>);
  if (local_40.append_state.
      super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
      .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_40.append_state.
                          super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
                          .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>.
                          _M_head_impl + 8))();
  }
  uVar1.super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       local_40.lock;
  local_40.append_state.
  super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
  .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
        )(__uniq_ptr_data<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>,_true,_true>
          )0x0;
  if (local_40.lock.
      super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
      super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
      .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
       )0x0) {
    StorageLockKey::~StorageLockKey
              ((StorageLockKey *)
               local_40.lock.
               super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
               .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl);
    operator_delete((void *)uVar1.
                            super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
                            .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl);
  }
  local_40.lock.
  super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
        )0x0;
  ::std::vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>::~vector
            (&local_40.child_appends.
              super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>);
  return;
}

Assistant:

void ArrayColumnData::InitializeAppend(ColumnAppendState &state) {
	ColumnAppendState validity_append;
	validity.InitializeAppend(validity_append);
	state.child_appends.push_back(std::move(validity_append));

	ColumnAppendState child_append;
	child_column->InitializeAppend(child_append);
	state.child_appends.push_back(std::move(child_append));
}